

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PairedReadsMapper.cc
# Opt level: O2

sgNodeID_t __thiscall
PairedReadsMapper::get_node_inmediate_neighbours(PairedReadsMapper *this,sgNodeID_t node)

{
  key_type *pkVar1;
  pointer ppVar2;
  mapped_type *pmVar3;
  ulong uVar4;
  pointer ppVar5;
  pair<long,_int> *cand;
  long lVar6;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> *__range1;
  long *node_1;
  key_type *__k;
  vector<long,_std::allocator<long>_> *path;
  __node_base _Var7;
  long lVar8;
  pointer ppVar9;
  vector<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_> count_vector;
  pair<long,_int> local_70;
  unordered_map<long,_int,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_int>_>_>
  counter;
  
  counter._M_h._M_buckets = &counter._M_h._M_single_bucket;
  counter._M_h._M_bucket_count = 1;
  counter._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  counter._M_h._M_element_count = 0;
  counter._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  counter._M_h._M_rehash_policy._M_next_resize = 0;
  counter._M_h._M_single_bucket = (__node_base_ptr)0x0;
  all_paths_fw((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                *)&count_vector,this,node,true,true);
  for (; count_vector.
         super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl.
         super__Vector_impl_data._M_start !=
         count_vector.
         super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>._M_impl.
         super__Vector_impl_data._M_finish;
      count_vector.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)&count_vector.
                     super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[1].second) {
    pkVar1 = *(key_type **)
              &(count_vector.
                super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start)->second;
    for (__k = (key_type *)
               (count_vector.
                super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
                _M_impl.super__Vector_impl_data._M_start)->first; __k != pkVar1; __k = __k + 1) {
      pmVar3 = std::__detail::
               _Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&counter,__k);
      *pmVar3 = *pmVar3 + 1;
    }
  }
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::~vector((vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
             *)&count_vector);
  count_vector.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  count_vector.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  count_vector.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  for (_Var7 = counter._M_h._M_before_begin;
      ppVar5 = count_vector.
               super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,
      ppVar2 = count_vector.
               super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start, _Var7._M_nxt != (_Hash_node_base *)0x0;
      _Var7._M_nxt = (_Var7._M_nxt)->_M_nxt) {
    local_70.first = (long)_Var7._M_nxt[1]._M_nxt;
    local_70.second = *(int *)&_Var7._M_nxt[2]._M_nxt;
    std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>::
    emplace_back<std::pair<long,int>>
              ((vector<std::pair<long,int>,std::allocator<std::pair<long,int>>> *)&count_vector,
               &local_70);
  }
  if (count_vector.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      count_vector.super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    lVar8 = (long)count_vector.
                  super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)count_vector.
                  super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    uVar4 = lVar8 >> 4;
    lVar6 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<long,int>*,std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<PairedReadsMapper::get_node_inmediate_neighbours(long)::__0>>
              (count_vector.
               super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start,
               count_vector.
               super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish,((uint)lVar6 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar8 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long,int>*,std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<PairedReadsMapper::get_node_inmediate_neighbours(long)::__0>>
                (ppVar2,ppVar5);
      ppVar2 = count_vector.
               super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    else {
      ppVar9 = ppVar2 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<long,int>*,std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<PairedReadsMapper::get_node_inmediate_neighbours(long)::__0>>
                (ppVar2,ppVar9);
      for (; ppVar2 = count_vector.
                      super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start, ppVar9 != ppVar5;
          ppVar9 = ppVar9 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<long,int>*,std::vector<std::pair<long,int>,std::allocator<std::pair<long,int>>>>,__gnu_cxx::__ops::_Val_comp_iter<PairedReadsMapper::get_node_inmediate_neighbours(long)::__0>>
                  (ppVar9);
      }
    }
  }
  do {
    ppVar5 = ppVar2;
    if (ppVar5 == count_vector.
                  super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      lVar6 = 0;
      break;
    }
    lVar6 = ppVar5->first;
    ppVar2 = ppVar5 + 1;
  } while ((lVar6 == 0) || (ppVar5->second < 0xb));
  std::_Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>::~_Vector_base
            (&count_vector.
              super__Vector_base<std::pair<long,_int>,_std::allocator<std::pair<long,_int>_>_>);
  std::
  _Hashtable<long,_std::pair<const_long,_int>,_std::allocator<std::pair<const_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&counter._M_h);
  return lVar6;
}

Assistant:

sgNodeID_t PairedReadsMapper::get_node_inmediate_neighbours(sgNodeID_t node){
    // 0 returning node is equivalent to None (in python)
    sgNodeID_t next_node=0;
    std::unordered_map<sgNodeID_t, int> counter;
    for(const auto &path: all_paths_fw(node)){
        for (const auto &node: path){
            counter[node]++;
        }
    }

    std::vector<std::pair<sgNodeID_t, int>> count_vector;
    for (const auto &x: counter){
        count_vector.push_back(x);
    }
    std::sort(count_vector.begin(), count_vector.end(), [](std::pair<sgNodeID_t, int>& a, std::pair<sgNodeID_t, int>& b){return a.second>b.second;});

    for (const auto& cand: count_vector){
        if (cand.first != 0 and cand.second>10){
            return cand.first;
        }
    }
    return next_node;
}